

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool basist::transcode_uastc_to_etc2_eac_rg11
               (uastc_block *src_blk,void *pDst,bool high_quality,uint32_t chan0,uint32_t chan1)

{
  bool bVar1;
  code *pcVar2;
  color32 block_pixels [4] [4];
  unpacked_uastc_block unpacked_src_blk;
  color32 acStack_108 [18];
  unpacked_uastc_block local_c0;
  
  bVar1 = unpack_uastc(src_blk,&local_c0,false,true);
  if (bVar1) {
    if (local_c0.m_mode == 8) {
      *(ushort *)pDst = *(byte *)((long)(&local_c0.m_astc + 1) + (ulong)chan0 + 8) | 0xd00;
      *(undefined4 *)((long)pDst + 2) = 0x92244992;
      *(undefined2 *)((long)pDst + 6) = 0x2449;
      *(ushort *)((long)pDst + 8) =
           *(byte *)((long)(&local_c0.m_astc + 1) + (ulong)chan1 + 8) | 0xd00;
      *(undefined4 *)((long)pDst + 10) = 0x92244992;
      *(undefined2 *)((long)pDst + 0xe) = 0x2449;
    }
    else {
      unpack_uastc(local_c0.m_mode,local_c0.m_common_pattern,&local_c0.m_solid_color,
                   &local_c0.m_astc,acStack_108,false);
      if (chan0 == 3) {
        transcode_uastc_to_etc2_eac_a8(&local_c0,(color32 (*) [4])acStack_108,pDst);
      }
      else {
        pcVar2 = pack_eac;
        if (high_quality) {
          pcVar2 = pack_eac_high_quality;
        }
        (*pcVar2)(pDst,(long)&acStack_108[0].field_0 + (ulong)chan0,4);
      }
      if (chan1 == 3) {
        transcode_uastc_to_etc2_eac_a8
                  (&local_c0,(color32 (*) [4])acStack_108,(void *)((long)pDst + 8));
      }
      else {
        pcVar2 = pack_eac;
        if (high_quality) {
          pcVar2 = pack_eac_high_quality;
        }
        (*pcVar2)((long)pDst + 8,(long)&acStack_108[0].field_0 + (ulong)chan1,4);
      }
    }
  }
  return bVar1;
}

Assistant:

bool transcode_uastc_to_etc2_eac_rg11(const uastc_block& src_blk, void* pDst, bool high_quality, uint32_t chan0, uint32_t chan1)
	{
		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			pack_eac_solid_block(static_cast<eac_block*>(pDst)[0], unpacked_src_blk.m_solid_color.c[chan0]);
			pack_eac_solid_block(static_cast<eac_block*>(pDst)[1], unpacked_src_blk.m_solid_color.c[chan1]);
			return true;
		}

		color32 block_pixels[4][4];
		const bool unpack_srgb = false;
		if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
			return false;

		if (chan0 == 3)
			transcode_uastc_to_etc2_eac_a8(unpacked_src_blk, block_pixels, &static_cast<eac_block*>(pDst)[0]);
		else
			(high_quality ? pack_eac_high_quality : pack_eac)(static_cast<eac_block*>(pDst)[0], &block_pixels[0][0].c[chan0], sizeof(color32));

		if (chan1 == 3)
			transcode_uastc_to_etc2_eac_a8(unpacked_src_blk, block_pixels, &static_cast<eac_block*>(pDst)[1]);
		else
			(high_quality ? pack_eac_high_quality : pack_eac)(static_cast<eac_block*>(pDst)[1], &block_pixels[0][0].c[chan1], sizeof(color32));
		return true;
	}